

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

atom * newMovingAtom(char *rec,void *userdata)

{
  undefined8 *puVar1;
  residue *r1;
  int iVar2;
  residue *prVar3;
  atom *theAtoms;
  
  if (rec != (char *)0x0) {
    prVar3 = *(residue **)((long)userdata + 0x30);
    if (prVar3 == (residue *)0x0) {
      prVar3 = newResidueData();
      *(residue **)((long)userdata + 0x30) = prVar3;
    }
    theAtoms = newAtom(rec,*userdata,0,prVar3);
    if (theAtoms != (atom *)0x0) {
      theAtoms->next = (atom_t *)0x0;
      if ((ImplicitH != '\x01') || (iVar2 = getAtno(theAtoms->elem), iVar2 != 1)) {
        selectSource(theAtoms,*(pattern **)((long)userdata + 0x18),1,
                     *(pattern **)((long)userdata + 0x20),2,(pattern *)0x0);
        puVar1 = *(undefined8 **)((long)userdata + 0x28);
        prVar3 = *(residue **)((long)userdata + 0x30);
        r1 = (residue *)*puVar1;
        if (r1 != (residue *)0x0) {
          iVar2 = resDiffersFromPrev(r1,prVar3);
          if (iVar2 == 0) {
            theAtoms->r = r1;
            r1->a = theAtoms;
            return theAtoms;
          }
          prVar3->nextRes = r1;
        }
        *puVar1 = prVar3;
        *(undefined8 *)((long)userdata + 0x30) = 0;
        return theAtoms;
      }
      free(theAtoms);
    }
  }
  return (atom *)0x0;
}

Assistant:

atom * newMovingAtom(char *rec, void *userdata)
{
   atom* a = NULL;
   movingAtomBuildInfo *m = (movingAtomBuildInfo *)userdata;

   if (rec == NULL) { return NULL; }

   if (m->scratchRes == NULL) {
      m->scratchRes = newResidueData();
   }

   /*atom * newAtom(char *rec, int file, int model, residue * resDataBuf)*/
   a = newAtom(rec, m->filenum, 0, m->scratchRes);
   if (a) {
      a->next = NULL;
      if (ImplicitH && isHatom(a->elem)) {
	 deleteAtom(a);  /* filter out implicit hydrogens */
	 return NULL;
      }

      selectSource(a, m->srcPat, SET1, m->targPat, SET2, NULL);
             /* note: new moving atom can not be ignored using -IGNORE flag */

      if (*(m->reslstptr) == NULL) {/* first residue goes on residue list */
	 *(m->reslstptr) = m->scratchRes;
	 m->scratchRes = NULL;
      }
      else { /* otherwise we have to compare residue data blocks */
	 if (resDiffersFromPrev(*(m->reslstptr), m->scratchRes)) {
	    m->scratchRes->nextRes = *(m->reslstptr);
	    *(m->reslstptr) = m->scratchRes;
	    m->scratchRes = NULL;

	 }
	 else {
	    a->r = *(m->reslstptr); /* same, so point to prior block */
	    a->r->a = a; /* makes this atom the head of atom list for this res */
	 }
      }
   }
   return a;
}